

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibOutline.cpp
# Opt level: O3

EntryData * getEntryData(EntryData *__return_storage_ptr__,TSNode entryNode,File *file)

{
  TSNode self;
  TSNode node;
  TSNode node_00;
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  uint32_t child_index;
  Range RVar4;
  TSNode child;
  string local_70;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  TSTree *in_stack_ffffffffffffffc8;
  
  pcVar3 = ts_node_type(entryNode);
  iVar1 = strcmp(pcVar3,"entry");
  if (iVar1 != 0) {
    __assert_fail("strcmp(ts_node_type(entryNode), \"entry\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/bibOutline.cpp"
                  ,0x12,"EntryData getEntryData(TSNode, File &)");
  }
  node.context[2] = (uint32_t)in_stack_ffffffffffffffb8;
  node.context[3] = SUB84(in_stack_ffffffffffffffb8,4);
  node.context[0] = (uint32_t)in_stack_ffffffffffffffb0;
  node.context[1] = SUB84(in_stack_ffffffffffffffb0,4);
  node.id = in_stack_ffffffffffffffc0;
  node.tree = in_stack_ffffffffffffffc8;
  RVar4 = nodeRange(node);
  EntryData::EntryData(__return_storage_ptr__,RVar4);
  uVar2 = ts_node_named_child_count(entryNode);
  if (uVar2 != 0) {
    child_index = 0;
    do {
      ts_node_named_child((TSNode *)&stack0xffffffffffffffb0,entryNode,child_index);
      self.context[2] = (uint32_t)in_stack_ffffffffffffffb8;
      self.context[3] = SUB84(in_stack_ffffffffffffffb8,4);
      self.context[0] = (uint32_t)in_stack_ffffffffffffffb0;
      self.context[1] = SUB84(in_stack_ffffffffffffffb0,4);
      self.id = in_stack_ffffffffffffffc0;
      self.tree = in_stack_ffffffffffffffc8;
      pcVar3 = ts_node_type(self);
      iVar1 = strcmp(pcVar3,"name");
      if (iVar1 == 0) {
        File::utf8TextForNode_abi_cxx11_(&local_70,file,(TSNode *)&stack0xffffffffffffffb0);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_70)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        node_00.context[2] = (uint32_t)in_stack_ffffffffffffffb8;
        node_00.context[3] = SUB84(in_stack_ffffffffffffffb8,4);
        node_00.context[0] = (uint32_t)in_stack_ffffffffffffffb0;
        node_00.context[1] = SUB84(in_stack_ffffffffffffffb0,4);
        node_00.id = in_stack_ffffffffffffffc0;
        node_00.tree = in_stack_ffffffffffffffc8;
        RVar4 = nodeRange(node_00);
        __return_storage_ptr__->selectionRange = RVar4;
        iVar1 = std::__cxx11::string::compare((char *)&__return_storage_ptr__->name);
        if (iVar1 == 0) {
          __return_storage_ptr__->kind = File;
        }
      }
      else {
        iVar1 = strcmp(pcVar3,"key");
        if (iVar1 == 0) {
          File::utf8TextForNode_abi_cxx11_(&local_70,file,(TSNode *)&stack0xffffffffffffffb0);
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->key,(string *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            return __return_storage_ptr__;
          }
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          return __return_storage_ptr__;
        }
      }
      child_index = child_index + 1;
    } while (uVar2 != child_index);
  }
  return __return_storage_ptr__;
}

Assistant:

EntryData getEntryData (TSNode entryNode, File &file) {
    assert(strcmp(ts_node_type(entryNode), "entry") == 0);

    EntryData data { nodeRange(entryNode) };

    auto numChildren = ts_node_named_child_count(entryNode);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(entryNode, i);
        const char *type = ts_node_type(child);
        if (strcmp(type, "name") == 0) {
            data.name = file.utf8TextForNode(child);
            data.selectionRange = nodeRange(child);
            setEntryKind(data);
        } else if (strcmp(type, "key") == 0) {
            data.key = file.utf8TextForNode(child);
            return data;
        }
    }

    return data;
}